

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_CommitAfterAppendingAndWriting4Mb_Test::
~Transaction_CommitAfterAppendingAndWriting4Mb_Test
          (Transaction_CommitAfterAppendingAndWriting4Mb_Test *this)

{
  (this->super_Transaction).super_Test._vptr_Test = (_func_int **)&PTR__Transaction_00277410;
  (this->super_Transaction).db_.super_database._vptr_database =
       (_func_int **)&PTR__mock_database_00277450;
  testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::~FunctionMocker
            (&(this->super_Transaction).db_.gmock02_allocate_52);
  testing::internal::
  FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  ~FunctionMocker(&(this->super_Transaction).db_.gmock14_get_51);
  pstore::database::~database(&(this->super_Transaction).db_.super_database);
  in_memory_store::~in_memory_store(&(this->super_Transaction).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, CommitAfterAppendingAndWriting4Mb) {
    static constexpr auto elements = std::size_t{32};
    using element_type = int;

    // A collection of "initial" values which will fill the first region except for (elements/2)
    // integers.
    static constexpr std::size_t initial_elements =
        (pstore::address::segment_size - (pstore::leader_size + sizeof (pstore::trailer)) -
         (elements / 2U) * sizeof (element_type)) /
        sizeof (element_type);

    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto addr = pstore::typed_address<element_type>::null ();
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        {
            // A first allocation to fill up most of the first segment.
            transaction.allocate (initial_elements * sizeof (element_type), alignof (element_type));

            // The second allocation should span the end of the first and the start of the second
            // segment.
            addr = pstore::typed_address<element_type>::make (
                transaction.allocate (elements * sizeof (element_type), alignof (element_type)));

            // Fill the second allocation with values,
            std::shared_ptr<element_type> ptr = transaction.getrw (addr, elements);
            std::iota (ptr.get (), ptr.get () + elements, 0);
        }
        transaction.commit ();
    }
    {
        std::vector<int> expected (elements);
        std::iota (std::begin (expected), std::end (expected), 0);

        std::shared_ptr<int const> v = db.getro (addr, elements);
        std::vector<int> actual (v.get (), v.get () + elements);

        EXPECT_THAT (actual, ::testing::ContainerEq (expected));
    }
}